

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

void Am_Standard_Print(ostream *out,unsigned_long val,Am_ID_Tag type)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"(TypeID=",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  return;
}

Assistant:

void
Am_Standard_Print(std::ostream &out, unsigned long val, Am_ID_Tag type)
{
#ifdef DEBUG
  out << "(" << Am_Get_Type_Name(type) << ") " << std::hex << val << std::dec;
#else
  out << "(TypeID=" << type << ") " << std::hex << val << std::dec;
#endif
}